

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O2

bool __thiscall cinatra::uri_t::is_sub_delim(uri_t *this,int c)

{
  if (((0x3d < (uint)c) || ((0x28001fd200000000U >> ((ulong)(uint)c & 0x3f) & 1) == 0)) &&
     (c != 0x7c)) {
    return false;
  }
  return true;
}

Assistant:

bool is_sub_delim(int c) {
    switch (c) {
      case '!':
      case '$':
      case '&':
      case '\'':
      case '|':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case ';':
      case '=':
        return true;
      default:
        return false;
    }
  }